

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

int AF_DBlockThingsIterator_CreateFromPos
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double checkx;
  double checky;
  double checkz;
  double checkh;
  double checkradius;
  int iVar1;
  DBlockThingsIterator *this;
  char *pcVar2;
  int iVar3;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x01') {
      if (numparam == 1) {
        pcVar2 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          if ((uint)numparam < 3) {
            pcVar2 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                pcVar2 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\x01') {
                  if ((uint)numparam < 5) {
                    pcVar2 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\x01') {
                      if (numparam == 5) {
                        pcVar2 = "(paramnum) < numparam";
                      }
                      else {
                        if (param[5].field_0.field_3.Type == '\0') {
                          checkx = (param->field_0).f;
                          checky = param[1].field_0.f;
                          checkz = param[2].field_0.f;
                          checkh = param[3].field_0.f;
                          checkradius = param[4].field_0.f;
                          iVar1 = param[5].field_0.i;
                          this = (DBlockThingsIterator *)
                                 M_Malloc_Dbg(0x218,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                              ,0x1f9);
                          iVar3 = 0;
                          DBlockThingsIterator::DBlockThingsIterator
                                    (this,checkx,checky,checkz,checkh,checkradius,iVar1 != 0,
                                     (sector_t *)0x0);
                          if (0 < numret) {
                            if (ret == (VMReturn *)0x0) {
                              __assert_fail("ret != NULL",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                                            ,0x4c7,
                                            "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                           );
                            }
                            iVar3 = 1;
                            VMReturn::SetPointer(ret,this,1);
                          }
                          return iVar3;
                        }
                        pcVar2 = "param[paramnum].Type == REGT_INT";
                      }
                      __assert_fail(pcVar2,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                                    ,0x4c6,
                                    "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    pcVar2 = "param[paramnum].Type == REGT_FLOAT";
                  }
                  __assert_fail(pcVar2,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                                ,0x4c5,
                                "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar2 = "param[paramnum].Type == REGT_FLOAT";
              }
              __assert_fail(pcVar2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                            ,0x4c4,
                            "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar2 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                        ,0x4c3,
                        "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar2 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x4c2,
                    "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar2 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x4c1,
                "int AF_DBlockThingsIterator_CreateFromPos(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DBlockThingsIterator, CreateFromPos)
{
	PARAM_PROLOGUE;
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_FLOAT(h);
	PARAM_FLOAT(radius);
	PARAM_BOOL(ignore);
	ACTION_RETURN_OBJECT(new DBlockThingsIterator(x, y, z, h, radius, ignore, nullptr));
}